

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O1

void benchmark::BenchmarkReporter::ComputeStats
               (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *reports,Run *mean_data,Run *stddev_data)

{
  pointer pRVar1;
  pointer pRVar2;
  size_t sVar3;
  long lVar4;
  _Alloc_hider _Var5;
  size_t __n;
  Run *pRVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer pRVar13;
  size_type *psVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  double local_b0;
  double local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  CheckHandler local_68;
  double local_60;
  double local_58;
  double local_50;
  Run *local_48;
  CheckHandler local_40;
  CheckHandler local_38;
  
  uVar12 = ((long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  local_48 = stddev_data;
  if (uVar12 < 2) {
    internal::CheckHandler::CheckHandler
              (&local_68,"reports.size() >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
               ,"ComputeStats",0x1c);
  }
  else {
    local_68.log_ = internal::GetNullLogInstance();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_68.log_,"Cannot compute stats for less than 2 reports",0x2c);
  if (uVar12 < 2) {
    internal::CheckHandler::~CheckHandler(&local_68);
  }
  pRVar13 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = pRVar13->iterations;
  if (pRVar13 == pRVar1) {
    local_b0 = 0.0;
    lVar15 = 0;
    local_e8 = 0.0;
    dVar18 = 0.0;
    local_f0 = 0.0;
    lVar10 = 0;
    local_c8 = 0.0;
    local_f8 = 0.0;
    lVar11 = 0;
    local_a8 = 0.0;
    local_d8 = 0.0;
    lVar9 = 0;
  }
  else {
    local_d8 = 0.0;
    lVar9 = 0;
    local_a8 = 0.0;
    lVar11 = 0;
    local_f8 = 0.0;
    local_c8 = 0.0;
    lVar10 = 0;
    local_f0 = 0.0;
    dVar18 = 0.0;
    lVar15 = 0;
    local_e8 = 0.0;
    local_b0 = 0.0;
    do {
      pRVar2 = (reports->
               super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar3 = (pRVar2->benchmark_name)._M_string_length;
      if (sVar3 == (pRVar13->benchmark_name)._M_string_length) {
        if (sVar3 == 0) {
          bVar16 = true;
        }
        else {
          iVar7 = bcmp((pRVar2->benchmark_name)._M_dataplus._M_p,
                       (pRVar13->benchmark_name)._M_dataplus._M_p,sVar3);
          bVar16 = iVar7 == 0;
        }
      }
      else {
        bVar16 = false;
      }
      if (!bVar16) {
        internal::CheckHandler::CheckHandler
                  (&local_38,"(reports[0].benchmark_name) == (run.benchmark_name)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                   ,"ComputeStats",0x28);
        internal::CheckHandler::~CheckHandler(&local_38);
      }
      internal::GetNullLogInstance();
      if (lVar8 != pRVar13->iterations) {
        internal::CheckHandler::CheckHandler
                  (&local_40,"(run_iterations) == (run.iterations)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                   ,"ComputeStats",0x29);
        internal::CheckHandler::~CheckHandler(&local_40);
      }
      internal::GetNullLogInstance();
      lVar4 = pRVar13->iterations;
      dVar17 = (double)lVar4;
      dVar19 = pRVar13->real_accumulated_time / dVar17;
      local_d8 = local_d8 + dVar19 * dVar17;
      local_a8 = local_a8 + dVar19 * dVar19 * dVar17;
      lVar9 = lVar9 + lVar4;
      dVar19 = pRVar13->cpu_accumulated_time / dVar17;
      local_f8 = local_f8 + dVar19 * dVar17;
      local_c8 = local_c8 + dVar19 * dVar19 * dVar17;
      lVar11 = lVar11 + lVar4;
      dVar19 = pRVar13->items_per_second;
      local_e8 = local_e8 + dVar19 * dVar17;
      local_b0 = local_b0 + dVar19 * dVar19 * dVar17;
      lVar15 = lVar15 + lVar4;
      dVar19 = pRVar13->bytes_per_second;
      local_f0 = local_f0 + dVar19 * dVar17;
      dVar18 = dVar18 + dVar19 * dVar19 * dVar17;
      lVar10 = lVar10 + lVar4;
      pRVar13 = pRVar13 + 1;
    } while (pRVar13 != pRVar1);
  }
  pRVar13 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_88[0] = local_78;
  _Var5._M_p = (pRVar13->benchmark_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,_Var5._M_p,_Var5._M_p + (pRVar13->benchmark_name)._M_string_length);
  std::__cxx11::string::append((char *)local_88);
  std::__cxx11::string::operator=((string *)mean_data,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  mean_data->iterations = lVar8;
  local_60 = 1.0 / (double)lVar9;
  local_d8 = local_d8 * local_60;
  dVar19 = 0.0;
  if (lVar9 != 0) {
    dVar19 = local_d8;
  }
  mean_data->real_accumulated_time = dVar19 * (double)lVar8;
  local_58 = 1.0 / (double)lVar11;
  local_f8 = local_f8 * local_58;
  dVar19 = 0.0;
  if (lVar11 != 0) {
    dVar19 = local_f8;
  }
  mean_data->cpu_accumulated_time = dVar19 * (double)lVar8;
  local_50 = 1.0 / (double)lVar10;
  local_f0 = local_f0 * local_50;
  dVar19 = 0.0;
  if (lVar10 != 0) {
    dVar19 = local_f0;
  }
  mean_data->bytes_per_second = dVar19;
  local_e8 = local_e8 * (1.0 / (double)lVar15);
  dVar19 = 0.0;
  if (lVar15 != 0) {
    dVar19 = local_e8;
  }
  mean_data->items_per_second = dVar19;
  std::__cxx11::string::_M_assign((string *)&mean_data->report_label);
  pRVar13 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar13 >> 4) *
           0x6db6db6db6db6db7;
  if (1 < uVar12) {
    sVar3 = (pRVar13->report_label)._M_string_length;
    lVar8 = uVar12 - 1;
    psVar14 = &pRVar13[1].report_label._M_string_length;
    do {
      __n = *psVar14;
      if ((__n != sVar3) ||
         ((__n != 0 &&
          (iVar7 = bcmp((((string *)(psVar14 + -1))->_M_dataplus)._M_p,
                        (pRVar13->report_label)._M_dataplus._M_p,__n), iVar7 != 0)))) {
        std::__cxx11::string::_M_replace
                  ((ulong)&mean_data->report_label,0,
                   (char *)(mean_data->report_label)._M_string_length,0x11f3ee);
        break;
      }
      psVar14 = psVar14 + 0xe;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  pRVar13 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_88[0] = local_78;
  _Var5._M_p = (pRVar13->benchmark_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,_Var5._M_p,_Var5._M_p + (pRVar13->benchmark_name)._M_string_length);
  std::__cxx11::string::append((char *)local_88);
  pRVar6 = local_48;
  std::__cxx11::string::operator=((string *)local_48,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  std::__cxx11::string::_M_assign((string *)&pRVar6->report_label);
  pRVar6->iterations = 0;
  dVar19 = 0.0;
  if (lVar9 != 0) {
    dVar17 = local_a8 * local_60 - local_d8 * local_d8;
    dVar19 = 0.0;
    if (0.0 <= dVar17) {
      if (dVar17 < 0.0) {
        dVar19 = sqrt(dVar17);
      }
      else {
        dVar19 = SQRT(dVar17);
      }
    }
  }
  dVar17 = 0.0;
  pRVar6->real_accumulated_time = dVar19;
  if ((lVar11 != 0) && (dVar19 = local_c8 * local_58 - local_f8 * local_f8, 0.0 <= dVar19)) {
    if (dVar19 < 0.0) {
      dVar17 = sqrt(dVar19);
    }
    else {
      dVar17 = SQRT(dVar19);
    }
  }
  pRVar6->cpu_accumulated_time = dVar17;
  dVar19 = 0.0;
  if (lVar10 != 0) {
    dVar18 = dVar18 * local_50 - local_f0 * local_f0;
    dVar19 = 0.0;
    if (0.0 <= dVar18) {
      if (dVar18 < 0.0) {
        dVar19 = sqrt(dVar18);
      }
      else {
        dVar19 = SQRT(dVar18);
      }
    }
  }
  dVar18 = 0.0;
  pRVar6->bytes_per_second = dVar19;
  if ((lVar15 != 0) &&
     (dVar19 = local_b0 * (1.0 / (double)lVar15) - local_e8 * local_e8, 0.0 <= dVar19)) {
    if (dVar19 < 0.0) {
      dVar18 = sqrt(dVar19);
    }
    else {
      dVar18 = SQRT(dVar19);
    }
  }
  pRVar6->items_per_second = dVar18;
  return;
}

Assistant:

void BenchmarkReporter::ComputeStats(
    const std::vector<Run>& reports,
    Run* mean_data, Run* stddev_data) {
  CHECK(reports.size() >= 2) << "Cannot compute stats for less than 2 reports";
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time/run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time/run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  mean_data->benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data->iterations = run_iterations;
  mean_data->real_accumulated_time = real_accumulated_time_stat.Mean() *
                                     run_iterations;
  mean_data->cpu_accumulated_time = cpu_accumulated_time_stat.Mean() *
                                    run_iterations;
  mean_data->bytes_per_second = bytes_per_second_stat.Mean();
  mean_data->items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data->report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data->report_label = "";
      break;
    }
  }

  stddev_data->benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data->report_label = mean_data->report_label;
  stddev_data->iterations = 0;
  stddev_data->real_accumulated_time =
      real_accumulated_time_stat.StdDev();
  stddev_data->cpu_accumulated_time =
      cpu_accumulated_time_stat.StdDev();
  stddev_data->bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data->items_per_second = items_per_second_stat.StdDev();
}